

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

int uECC_sign(uint8_t *private_key,uint8_t *message_hash,uint hash_size,uint8_t *signature,
             uECC_Curve curve)

{
  int iVar1;
  ulong local_60;
  uECC_word_t tries;
  uECC_word_t k [4];
  uECC_Curve curve_local;
  uint8_t *signature_local;
  uint hash_size_local;
  uint8_t *message_hash_local;
  uint8_t *private_key_local;
  
  local_60 = 0;
  k[3] = (uECC_word_t)curve;
  while( true ) {
    if (0x3f < local_60) {
      return 0;
    }
    iVar1 = uECC_generate_random_int
                      (&tries,(uECC_word_t *)(k[3] + 0x28),
                       (wordcount_t)((*(short *)(k[3] + 2) + 0x3f) / 0x40));
    if (iVar1 == 0) break;
    iVar1 = uECC_sign_with_k(private_key,message_hash,hash_size,&tries,signature,(uECC_Curve)k[3]);
    if (iVar1 != 0) {
      return 1;
    }
    local_60 = local_60 + 1;
  }
  return 0;
}

Assistant:

int uECC_sign(const uint8_t *private_key,
              const uint8_t *message_hash,
              unsigned hash_size,
              uint8_t *signature,
              uECC_Curve curve) {
    uECC_word_t k[uECC_MAX_WORDS];
    uECC_word_t tries;

    for (tries = 0; tries < uECC_RNG_MAX_TRIES; ++tries) {
        if (!uECC_generate_random_int(k, curve->n, BITS_TO_WORDS(curve->num_n_bits))) {
            return 0;
        }

        if (uECC_sign_with_k(private_key, message_hash, hash_size, k, signature, curve)) {
            return 1;
        }
    }
    return 0;
}